

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderLibrary.cpp
# Opt level: O0

void vkt::anon_unknown_0::specializeShaderSources
               (ProgramSources *dst,ProgramSources *src,ProgramSpecializationParams *specParams,
               ShaderType shaderType,
               _func_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_ProgramSpecializationParams_ptr
               *specializationGenerator)

{
  undefined8 uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference str;
  ShaderSource local_100;
  undefined1 local_d8 [8];
  string sourceWithExts;
  string baseGLSLCode;
  undefined1 local_88 [8];
  StringTemplate tmpl;
  size_t ndx;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tmplParams;
  _func_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_ProgramSpecializationParams_ptr
  *specializationGenerator_local;
  ShaderType shaderType_local;
  ProgramSpecializationParams *specParams_local;
  ProgramSources *src_local;
  ProgramSources *dst_local;
  
  tmplParams._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)specializationGenerator;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(src->sources + shaderType);
  if (!bVar2) {
    (*(code *)tmplParams._M_t._M_impl.super__Rb_tree_header._M_node_count)(&ndx,specParams);
    tmpl.m_template.field_2._8_8_ = 0;
    while( true ) {
      uVar1 = tmpl.m_template.field_2._8_8_;
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(src->sources + shaderType);
      if (sVar3 <= (ulong)uVar1) break;
      str = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](src->sources + shaderType,tmpl.m_template.field_2._8_8_);
      tcu::StringTemplate::StringTemplate((StringTemplate *)local_88,str);
      tcu::StringTemplate::specialize
                ((string *)((long)&sourceWithExts.field_2 + 8),(StringTemplate *)local_88,
                 (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&ndx);
      glu::sl::injectExtensionRequirements
                ((string *)local_d8,(string *)((long)&sourceWithExts.field_2 + 8),
                 &specParams->requiredExtensions,shaderType);
      glu::ShaderSource::ShaderSource(&local_100,shaderType,(string *)local_d8);
      glu::ProgramSources::operator<<(dst,&local_100);
      glu::ShaderSource::~ShaderSource(&local_100);
      std::__cxx11::string::~string((string *)local_d8);
      std::__cxx11::string::~string((string *)(sourceWithExts.field_2._M_local_buf + 8));
      tcu::StringTemplate::~StringTemplate((StringTemplate *)local_88);
      tmpl.m_template.field_2._8_8_ = tmpl.m_template.field_2._8_8_ + 1;
    }
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)&ndx);
  }
  return;
}

Assistant:

void specializeShaderSources (ProgramSources&						dst,
							  const ProgramSources&					src,
							  const ProgramSpecializationParams&	specParams,
							  glu::ShaderType						shaderType,
							  map<string, string>					(*specializationGenerator) (const ProgramSpecializationParams& specParams))
{
	if (!src.sources[shaderType].empty())
	{
		const map<string, string>	tmplParams	= specializationGenerator(specParams);

		for (size_t ndx = 0; ndx < src.sources[shaderType].size(); ++ndx)
		{
			const StringTemplate	tmpl			(src.sources[shaderType][ndx]);
			const string			baseGLSLCode	= tmpl.specialize(tmplParams);
			const string			sourceWithExts	= injectExtensionRequirements(baseGLSLCode, specParams.requiredExtensions, shaderType);

			dst << glu::ShaderSource(shaderType, sourceWithExts);
		}
	}
}